

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

int ShFinalize(void)

{
  int iVar1;
  TSymbolTable *pTVar2;
  TPoolAllocator *pTVar3;
  long lVar4;
  long lVar5;
  int source;
  long lVar6;
  int p;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  int stage;
  long lVar11;
  bool bVar12;
  undefined8 *local_58;
  
  std::mutex::lock((mutex *)(anonymous_namespace)::init_lock);
  iVar1 = (anonymous_namespace)::NumberOfClients + -1;
  if (0 < (anonymous_namespace)::NumberOfClients) {
    bVar12 = (anonymous_namespace)::NumberOfClients == 1;
    (anonymous_namespace)::NumberOfClients = iVar1;
    if (bVar12) {
      local_58 = &(anonymous_namespace)::SharedSymbolTables;
      for (lVar4 = 0; lVar4 != 0x11; lVar4 = lVar4 + 1) {
        puVar8 = local_58;
        for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
          puVar9 = puVar8;
          for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
            puVar10 = puVar9;
            for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
              for (lVar11 = 0; lVar11 != 0xe; lVar11 = lVar11 + 1) {
                pTVar2 = (TSymbolTable *)puVar10[lVar11];
                if (pTVar2 != (TSymbolTable *)0x0) {
                  glslang::TSymbolTable::~TSymbolTable(pTVar2);
                }
                operator_delete(pTVar2,0x28);
                puVar10[lVar11] = 0;
              }
              puVar10 = puVar10 + 0xe;
            }
            puVar9 = puVar9 + 0x1c;
          }
          puVar8 = puVar8 + 0x70;
        }
        local_58 = local_58 + 0x1c0;
      }
      local_58 = &(anonymous_namespace)::CommonSymbolTable;
      for (lVar4 = 0; pTVar3 = (anonymous_namespace)::PerProcessGPA, lVar4 != 0x11;
          lVar4 = lVar4 + 1) {
        puVar8 = local_58;
        for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
          puVar9 = puVar8;
          for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
            puVar10 = puVar9;
            for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
              for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
                pTVar2 = (TSymbolTable *)puVar10[lVar11];
                if (pTVar2 != (TSymbolTable *)0x0) {
                  glslang::TSymbolTable::~TSymbolTable(pTVar2);
                }
                operator_delete(pTVar2,0x28);
                puVar10[lVar11] = 0;
              }
              puVar10 = puVar10 + 2;
            }
            puVar9 = puVar9 + 4;
          }
          puVar8 = puVar8 + 0x10;
        }
        local_58 = local_58 + 0x40;
      }
      if ((anonymous_namespace)::PerProcessGPA != (TPoolAllocator *)0x0) {
        glslang::TPoolAllocator::~TPoolAllocator((anonymous_namespace)::PerProcessGPA);
        operator_delete(pTVar3,0x60);
        (anonymous_namespace)::PerProcessGPA = (TPoolAllocator *)0x0;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::init_lock);
    return 1;
  }
  (anonymous_namespace)::NumberOfClients = iVar1;
  __assert_fail("NumberOfClients >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ShaderLang.cpp"
                ,0x574,"int ShFinalize()");
}

Assistant:

int ShFinalize()
{
#ifndef DISABLE_THREAD_SUPPORT
    const std::lock_guard<std::mutex> lock(init_lock);
#endif
    --NumberOfClients;
    assert(NumberOfClients >= 0);
    if (NumberOfClients > 0)
        return 1;

    for (int version = 0; version < VersionCount; ++version) {
        for (int spvVersion = 0; spvVersion < SpvVersionCount; ++spvVersion) {
            for (int p = 0; p < ProfileCount; ++p) {
                for (int source = 0; source < SourceCount; ++source) {
                    for (int stage = 0; stage < EShLangCount; ++stage) {
                        delete SharedSymbolTables[version][spvVersion][p][source][stage];
                        SharedSymbolTables[version][spvVersion][p][source][stage] = nullptr;
                    }
                }
            }
        }
    }

    for (int version = 0; version < VersionCount; ++version) {
        for (int spvVersion = 0; spvVersion < SpvVersionCount; ++spvVersion) {
            for (int p = 0; p < ProfileCount; ++p) {
                for (int source = 0; source < SourceCount; ++source) {
                    for (int pc = 0; pc < EPcCount; ++pc) {
                        delete CommonSymbolTable[version][spvVersion][p][source][pc];
                        CommonSymbolTable[version][spvVersion][p][source][pc] = nullptr;
                    }
                }
            }
        }
    }

    if (PerProcessGPA != nullptr) {
        delete PerProcessGPA;
        PerProcessGPA = nullptr;
    }

    return 1;
}